

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O3

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *pvVar5;
  LRN *pLVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  void *pvVar17;
  void *pvVar18;
  int *piVar19;
  int *piVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  ulong local_140;
  allocator_type local_121;
  Option *local_120;
  int *local_118;
  ulong local_110;
  void *local_108;
  ulong local_100;
  void *ptr_1;
  int *piStack_f0;
  ulong local_e8;
  int local_e0;
  Allocator *local_d8;
  int iStack_d0;
  uint uStack_cc;
  uint local_c8;
  uint local_c4;
  ulong local_c0;
  int *local_b8;
  LRN *local_b0;
  Mat local_a8;
  long local_68;
  void *local_60;
  long local_58;
  void *local_50;
  void *ptr;
  pointer local_38;
  
  uVar24 = bottom_top_blob->w;
  local_a8.h = bottom_top_blob->h;
  local_100 = (ulong)(uint)local_a8.h;
  uVar9 = bottom_top_blob->c;
  piVar20 = (int *)(ulong)uVar9;
  pvVar18 = (void *)(long)(int)uVar9;
  uVar13 = bottom_top_blob->elemsize;
  uVar16 = local_a8.h * uVar24;
  local_a8.allocator = opt->workspace_allocator;
  local_a8.data = (void *)0x0;
  local_a8.refcount = (int *)0x0;
  local_a8.packing = 1;
  local_a8.dims = 3;
  uVar11 = (long)(int)uVar16 * uVar13 + 0xf & 0xfffffffffffffff0;
  local_a8.cstep = uVar11 / uVar13;
  iVar8 = -100;
  local_a8.elemsize = uVar13;
  local_a8.w = uVar24;
  local_a8.c = uVar9;
  if (local_a8.cstep * (long)pvVar18 != 0) {
    uVar21 = local_a8.cstep * (long)pvVar18 * uVar13 + 3 & 0xfffffffffffffffc;
    local_120 = opt;
    local_110 = uVar11;
    local_108 = pvVar18;
    if (local_a8.allocator == (Allocator *)0x0) {
      ptr_1 = (void *)0x0;
      iVar7 = posix_memalign(&ptr_1,0x10,uVar21 + 4);
      local_a8.data = (void *)0x0;
      if (iVar7 == 0) {
        local_a8.data = ptr_1;
      }
    }
    else {
      iVar7 = (*(local_a8.allocator)->_vptr_Allocator[2])(local_a8.allocator,uVar21 + 4);
      local_a8.data = (void *)CONCAT44(extraout_var,iVar7);
    }
    local_a8.refcount = (int *)((long)local_a8.data + uVar21);
    *(undefined4 *)((long)local_a8.data + uVar21) = 1;
    if (local_a8.cstep * (long)local_a8.c != 0) {
      if (0 < (int)uVar9) {
        pvVar18 = bottom_top_blob->data;
        sVar1 = bottom_top_blob->cstep;
        sVar2 = bottom_top_blob->elemsize;
        piVar19 = (int *)0x0;
        pvVar17 = local_a8.data;
        do {
          if (0 < (int)uVar16) {
            uVar11 = 0;
            do {
              fVar26 = *(float *)((long)pvVar18 + uVar11 * 4);
              *(float *)((long)pvVar17 + uVar11 * 4) = fVar26 * fVar26;
              uVar11 = uVar11 + 1;
            } while (uVar16 != uVar11);
          }
          piVar19 = (int *)((long)piVar19 + 1);
          pvVar17 = (void *)((long)pvVar17 + local_a8.elemsize * local_a8.cstep);
          pvVar18 = (void *)((long)pvVar18 + sVar1 * sVar2);
        } while (piVar19 != piVar20);
      }
      local_b0 = this;
      if (this->region_type == 0) {
        local_d8 = local_120->workspace_allocator;
        ptr_1 = (void *)0x0;
        piStack_f0 = (int *)0x0;
        local_e0 = 1;
        uStack_cc = uVar24;
        iStack_d0 = 3;
        local_c8 = (uint)local_100;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar13;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_110;
        local_c0 = SUB168(auVar4 / auVar3,0);
        local_e8 = uVar13;
        local_c4 = uVar9;
        if ((long)local_108 * local_c0 != 0) {
          uVar11 = (long)local_108 * local_c0 * uVar13 + 3 & 0xfffffffffffffffc;
          if (local_d8 == (Allocator *)0x0) {
            ptr = (void *)0x0;
            iVar8 = posix_memalign(&ptr,0x10,uVar11 + 4);
            ptr_1 = (void *)0x0;
            if (iVar8 == 0) {
              ptr_1 = ptr;
            }
          }
          else {
            iVar8 = (*local_d8->_vptr_Allocator[2])();
            ptr_1 = (void *)CONCAT44(extraout_var_00,iVar8);
          }
          local_118 = (int *)((long)ptr_1 + uVar11);
          *(undefined4 *)((long)ptr_1 + uVar11) = 1;
          uVar24 = SUB164(auVar4 / auVar3,0) * uVar9;
          piStack_f0 = local_118;
          if (0 < (int)uVar24) {
            memset(ptr_1,0,(ulong)uVar24 << 2);
          }
          if (0 < (int)uVar9) {
            fVar26 = local_b0->alpha;
            uVar24 = local_b0->local_size / 2;
            local_100 = (ulong)-uVar24;
            pvVar18 = bottom_top_blob->data;
            local_110 = (ulong)(int)uVar24;
            fVar27 = 1.0 / (float)local_b0->local_size;
            lVar15 = uVar13 * local_c0;
            local_108 = (void *)(bottom_top_blob->cstep * bottom_top_blob->elemsize);
            piVar19 = (int *)0x0;
            local_120 = (Option *)CONCAT44(local_120._4_4_,fVar27);
            pvVar17 = ptr_1;
            local_b8 = piVar20;
            do {
              pLVar6 = local_b0;
              uVar9 = (int)local_100 + (int)piVar19;
              if ((long)(int)uVar9 <= (long)(local_110 + (long)piVar19)) {
                do {
                  if (((int)uVar9 < (int)local_b8 && -1 < (int)uVar9) && (0 < (int)uVar16)) {
                    uVar13 = 0;
                    do {
                      *(float *)((long)pvVar17 + uVar13 * 4) =
                           *(float *)((long)pvVar17 + uVar13 * 4) +
                           *(float *)((long)local_a8.data +
                                     uVar13 * 4 + (ulong)uVar9 * local_a8.cstep * local_a8.elemsize)
                      ;
                      uVar13 = uVar13 + 1;
                    } while (uVar16 != uVar13);
                  }
                  bVar25 = uVar9 != uVar24;
                  uVar9 = uVar9 + 1;
                } while (bVar25);
              }
              if (0 < (int)uVar16) {
                uVar13 = 0;
                do {
                  fVar27 = powf(*(float *)((long)pvVar17 + uVar13 * 4) * fVar26 * fVar27 +
                                pLVar6->bias,-pLVar6->beta);
                  *(float *)((long)pvVar18 + uVar13 * 4) =
                       fVar27 * *(float *)((long)pvVar18 + uVar13 * 4);
                  uVar13 = uVar13 + 1;
                  fVar27 = local_120._0_4_;
                } while (uVar16 != uVar13);
              }
              uVar24 = uVar24 + 1;
              piVar19 = (int *)((long)piVar19 + 1);
              pvVar17 = (void *)((long)pvVar17 + lVar15);
              pvVar18 = (void *)((long)pvVar18 + (long)local_108);
            } while (piVar19 != local_b8);
          }
          LOCK();
          *local_118 = *local_118 + -1;
          UNLOCK();
          if (*local_118 == 0) {
            if (local_d8 == (Allocator *)0x0) {
              if (ptr_1 != (void *)0x0) {
                free(ptr_1);
              }
            }
            else {
              (*local_d8->_vptr_Allocator[3])();
            }
          }
          iVar8 = 0;
        }
      }
      else {
        iVar8 = 0;
        if (this->region_type == 1) {
          local_e8 = local_a8.elemsize;
          local_e0 = local_a8.packing;
          uStack_cc = local_a8.w;
          iStack_d0 = local_a8.dims;
          local_d8 = local_a8.allocator;
          local_c8 = local_a8.h;
          local_c4 = local_a8.c;
          local_c0 = local_a8.cstep;
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
          uVar9 = this->local_size;
          uVar16 = uVar24;
          ptr_1 = local_a8.data;
          piStack_f0 = local_a8.refcount;
          if (1 < (int)uVar9) {
            uVar16 = uVar9 >> 1;
            copy_make_border(&local_a8,(Mat *)&ptr_1,uVar16,~uVar16 + uVar9,uVar16,~uVar16 + uVar9,0
                             ,0.0,local_120->workspace_allocator,local_120->num_threads);
            if ((ptr_1 == (void *)0x0) || ((long)(int)local_c4 * local_c0 == 0)) {
              if (piStack_f0 != (int *)0x0) {
                LOCK();
                *piStack_f0 = *piStack_f0 + -1;
                UNLOCK();
                if (*piStack_f0 == 0) {
                  if (local_d8 == (Allocator *)0x0) {
                    if (ptr_1 != (void *)0x0) {
                      free(ptr_1);
                    }
                  }
                  else {
                    (*local_d8->_vptr_Allocator[3])();
                  }
                }
              }
              iVar8 = -100;
              goto LAB_001336a9;
            }
            uVar9 = this->local_size;
            uVar16 = uStack_cc;
          }
          uVar23 = uVar9 * uVar9;
          local_120 = (Option *)CONCAT44(local_120._4_4_,this->alpha);
          local_b8 = piVar20;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&ptr,(ulong)uVar23,&local_121);
          pvVar18 = ptr;
          iVar8 = this->local_size;
          if (0 < iVar8) {
            iVar22 = uVar16 - iVar8;
            iVar7 = 0;
            iVar10 = 0;
            iVar12 = 0;
            do {
              if (0 < iVar8) {
                lVar15 = 0;
                do {
                  *(int *)((long)ptr + lVar15 * 4 + (long)iVar12 * 4) = iVar10 + (int)lVar15;
                  iVar8 = this->local_size;
                  lVar15 = lVar15 + 1;
                  iVar14 = (int)lVar15;
                } while (iVar14 < iVar8);
                iVar12 = iVar12 + iVar14;
                iVar10 = iVar10 + iVar14;
              }
              iVar10 = iVar10 + iVar22;
              iVar7 = iVar7 + 1;
            } while (iVar7 < iVar8);
          }
          if (0 < (int)local_b8) {
            local_50 = bottom_top_blob->data;
            local_58 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
            local_60 = ptr_1;
            local_68 = local_c0 * local_e8;
            local_110 = (long)(int)uStack_cc * local_e8;
            local_118 = (int *)0x0;
            do {
              if (0 < (int)local_100) {
                local_108 = (void *)(local_68 * (long)local_118 + (long)local_60);
                pvVar17 = (void *)(local_58 * (long)local_118 + (long)local_50);
                local_140 = 0;
                do {
                  pvVar5 = local_108;
                  if (0 < (int)uVar24) {
                    lVar15 = local_140 * local_110;
                    uVar13 = 0;
                    do {
                      if (uVar9 == 0) {
                        fVar26 = 0.0;
                      }
                      else {
                        fVar26 = 0.0;
                        uVar11 = 0;
                        do {
                          fVar26 = fVar26 + *(float *)((long)pvVar5 +
                                                      (long)*(int *)((long)pvVar18 + uVar11 * 4) * 4
                                                      + uVar13 * 4 + lVar15);
                          uVar11 = uVar11 + 1;
                        } while (uVar23 + (uVar23 == 0) != uVar11);
                      }
                      fVar26 = powf(fVar26 * local_120._0_4_ * (1.0 / (float)(int)uVar23) +
                                    local_b0->bias,-local_b0->beta);
                      *(float *)((long)pvVar17 + uVar13 * 4) =
                           fVar26 * *(float *)((long)pvVar17 + uVar13 * 4);
                      uVar13 = uVar13 + 1;
                    } while (uVar13 != uVar24);
                  }
                  pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar24 * 4);
                  local_140 = local_140 + 1;
                } while (local_140 != local_100);
              }
              local_118 = (int *)((long)local_118 + 1);
            } while (local_118 != local_b8);
          }
          if (pvVar18 != (void *)0x0) {
            operator_delete(pvVar18,(long)local_38 - (long)pvVar18);
          }
          iVar8 = 0;
          if (piStack_f0 != (int *)0x0) {
            LOCK();
            *piStack_f0 = *piStack_f0 + -1;
            UNLOCK();
            if (*piStack_f0 == 0) {
              if (local_d8 == (Allocator *)0x0) {
                if (ptr_1 != (void *)0x0) {
                  free(ptr_1);
                }
              }
              else {
                (*local_d8->_vptr_Allocator[3])();
              }
            }
          }
        }
      }
    }
  }
LAB_001336a9:
  if (local_a8.refcount != (int *)0x0) {
    LOCK();
    *local_a8.refcount = *local_a8.refcount + -1;
    UNLOCK();
    if (*local_a8.refcount == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar8;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p=q - local_size / 2; p<=q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i=0; i<size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i=0; i<size; i++)
            {
                ptr[i] = ptr[i] * pow(bias + alpha_div_size * ssptr[i], -beta);
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}